

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirOUTPUT(void)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  int mode;
  path fnaam;
  path local_30;
  
  if (pass != 3) {
    SkipToEol(&lp);
    return;
  }
  GetOutputFileName_abi_cxx11_(&local_30,&lp);
  bVar1 = comma(&lp);
  mode = 0;
  if (bVar1) {
    iVar2 = SkipBlanks(&lp);
    mode = 0;
    bVar3 = 0;
    if (iVar2 == 0) {
      bVar3 = *lp | 0x20;
      lp = lp + 1;
    }
    if (bVar3 == 0x61) {
      mode = 2;
    }
    else if (bVar3 != 0x74) {
      if (bVar3 != 0x72) {
        Error("[OUTPUT] Invalid <mode> (valid modes: t, a, r)",bp,PASS3);
        goto LAB_00110168;
      }
      mode = 1;
    }
  }
  NewDest(&local_30,mode);
LAB_00110168:
  std::filesystem::__cxx11::path::~path(&local_30);
  return;
}

Assistant:

static void dirOUTPUT() {
	if (LASTPASS != pass) {
		SkipToEol(lp);
		return;
	}
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	char modechar = 0;
	int mode = OUTPUT_TRUNCATE;
	if (comma(lp)) {
		if (!SkipBlanks(lp)) modechar = (*lp++) | 0x20;
		switch (modechar) {
			case 't': mode = OUTPUT_TRUNCATE;	break;
			case 'r': mode = OUTPUT_REWIND;		break;
			case 'a': mode = OUTPUT_APPEND;		break;
			default:
				Error("[OUTPUT] Invalid <mode> (valid modes: t, a, r)", bp);
				return;
		}
	}
	//Options::NoDestinationFile = false;
	NewDest(fnaam, mode);
}